

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O1

Test * __thiscall CppUnit::TestFactoryRegistry::makeTest(TestFactoryRegistry *this)

{
  pointer pcVar1;
  TestSuite *this_00;
  string local_40;
  
  this_00 = (TestSuite *)operator_new(0x40);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->m_name)._M_string_length);
  TestSuite::TestSuite(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  addTestToSuite(this,this_00);
  return (Test *)this_00;
}

Assistant:

Test *
TestFactoryRegistry::makeTest()
{
  TestSuite *suite = new TestSuite( m_name );
  addTestToSuite( suite );
  return suite;
}